

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86_avx512::forward
          (ROIAlign_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Mat *this_00;
  size_t sVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  void *pvVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  float *pfVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  int iVar18;
  int pw;
  _func_int *p_Var19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [12];
  undefined1 in_ZMM6 [64];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 in_XMM16 [16];
  allocator_type local_d1;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  pointer local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Mat *local_88;
  ROIAlign_x86_avx512 *local_80;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  local_98._8_8_ = local_98._0_8_;
  auVar37 = in_ZMM6._4_12_;
  local_b0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar10 = local_b0->w;
  iVar18 = local_b0->h;
  uVar12 = local_b0->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),uVar12,
              local_b0->elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var19 = this->_vptr_ROIAlign_x86_avx512[-3];
    fVar30 = *(float *)(&this->field_0xd8 + (long)p_Var19);
    uVar1 = *local_b0[1].data;
    uVar2 = *(undefined8 *)((long)local_b0[1].data + 8);
    local_a8._0_4_ = fVar30 * (float)uVar1;
    local_a8._4_4_ = fVar30 * (float)((ulong)uVar1 >> 0x20);
    local_a8._8_4_ = fVar30 * 0.0;
    local_a8._12_4_ = fVar30 * 0.0;
    auVar28._0_4_ = (float)uVar2 * fVar30;
    auVar28._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar30;
    auVar28._8_4_ = fVar30 * 0.0;
    auVar28._12_4_ = fVar30 * 0.0;
    auVar28 = vsubps_avx(auVar28,local_a8);
    if ((&this->field_0xe0)[(long)p_Var19] == '\x01') {
      auVar8._8_4_ = 0xbf000000;
      auVar8._0_8_ = 0xbf000000bf000000;
      auVar8._12_4_ = 0xbf000000;
      local_a8 = vaddps_avx512vl(local_a8,auVar8);
    }
    else {
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar28 = vmaxps_avx512vl(auVar28,auVar26);
    }
    uVar16 = *(ulong *)(&this->field_0xd0 + (long)p_Var19);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar16;
    auVar26 = vcvtdq2ps_avx(auVar27);
    auVar8 = vrcpps_avx(auVar26);
    auVar35._0_4_ = auVar28._0_4_ * auVar8._0_4_;
    auVar35._4_4_ = auVar28._4_4_ * auVar8._4_4_;
    auVar35._8_4_ = auVar28._8_4_ * auVar8._8_4_;
    auVar35._12_4_ = auVar28._12_4_ * auVar8._12_4_;
    auVar28 = vfmsub213ps_fma(auVar26,auVar35,auVar28);
    local_c8 = vfnmadd213ps_fma(auVar28,auVar8,auVar35);
    iVar21 = (int)(uVar16 >> 0x20);
    local_88 = this_00;
    local_80 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var19) == 1) {
      bVar25 = 0 < *(int *)(&this->field_0xdc + (long)p_Var19);
      fVar30 = (float)*(int *)(&this->field_0xdc + (long)p_Var19);
      local_98 = vmovshdup_avx(local_c8);
      auVar28 = vroundss_avx(local_98,local_98,10);
      auVar26 = vroundss_avx(local_c8,local_c8,10);
      iVar11 = (int)(float)((uint)bVar25 * (int)fVar30 + (uint)!bVar25 * auVar28._0_4_);
      iVar24 = (int)(float)((uint)bVar25 * (int)fVar30 + (uint)!bVar25 * auVar26._0_4_);
      iVar22 = 1;
      if (1 < iVar11 * iVar24) {
        iVar22 = iVar11 * iVar24;
      }
      local_d0 = (_func_int **)CONCAT44(local_d0._4_4_,(float)iVar22);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar21 * (long)iVar11 * (long)(int)uVar16 * (long)iVar24,&local_d1)
      ;
      auVar28 = vmovshdup_avx(local_a8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                (iVar18,iVar10,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx512[-3]),iVar11,
                 iVar24,auVar28._0_4_,local_a8._0_4_,local_98._0_4_,local_c8._0_4_,iVar11,iVar24,
                 &pre_calc);
      uVar16 = 0;
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      pp_Var5 = this->_vptr_ROIAlign_x86_avx512;
      uVar14 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar14 = uVar16;
      }
      local_98._0_8_ = uVar14;
      for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        sVar3 = local_b0->cstep;
        sVar4 = local_b0->elemsize;
        pvVar6 = local_b0->data;
        pvVar17 = (void *)(local_88->cstep * uVar16 * local_88->elemsize + (long)local_88->data);
        p_Var19 = pp_Var5[-3];
        iVar10 = 0;
        for (iVar18 = 0; iVar18 < *(int *)(&this->field_0xd4 + (long)p_Var19); iVar18 = iVar18 + 1)
        {
          for (lVar20 = 0; lVar20 < *(int *)(&this->field_0xd0 + (long)p_Var19); lVar20 = lVar20 + 1
              ) {
            fVar30 = 0.0;
            iVar21 = iVar10;
            for (iVar22 = 0; iVar22 != iVar11; iVar22 = iVar22 + 1) {
              pfVar13 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar21].w1;
              iVar15 = iVar24;
              while (bVar25 = iVar15 != 0, iVar15 = iVar15 + -1, bVar25) {
                auVar28 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)pvVar6 +
                                               (ulong)(uint)(iVar11 * iVar24) * 4 +
                                               sVar3 * uVar16 * sVar4));
                auVar34._0_4_ = auVar28._0_4_ * *pfVar13;
                auVar34._4_4_ = auVar28._4_4_ * pfVar13[1];
                auVar34._8_4_ = auVar28._8_4_ * pfVar13[2];
                auVar34._12_4_ = auVar28._12_4_ * pfVar13[3];
                auVar28 = vhaddps_avx(auVar34,auVar34);
                auVar28 = vhaddps_avx(auVar28,auVar28);
                fVar30 = fVar30 + auVar28._0_4_;
                pfVar13 = pfVar13 + 8;
              }
              iVar21 = iVar21 + iVar24;
            }
            iVar10 = iVar10 + iVar11 * iVar24;
            *(float *)((long)pvVar17 + lVar20 * 4) = fVar30 * (1.0 / local_d0._0_4_);
            p_Var19 = pp_Var5[-3];
            this = local_80;
          }
          pvVar17 = (void *)((long)pvVar17 + (long)*(int *)(&this->field_0xd0 + (long)p_Var19) * 4);
        }
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var19) != 0) {
        return 0;
      }
      auVar31._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var19);
      auVar31._4_12_ = auVar37;
      auVar28 = vroundps_avx(local_c8,10);
      uVar9 = 0xff;
      if (*(int *)(&this->field_0xdc + (long)p_Var19) < 1) {
        uVar9 = 0;
      }
      auVar26 = vbroadcastss_avx512vl(auVar31);
      bVar25 = (bool)((byte)uVar9 & 1);
      bVar7 = (bool)((byte)(uVar9 >> 1) & 1);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar21 *
                 (long)(int)(float)((uint)bVar7 * auVar26._4_4_ | (uint)!bVar7 * auVar28._4_4_) *
                 (long)(int)uVar16 *
                 (long)(int)(float)((uint)bVar25 * auVar26._0_4_ | (uint)!bVar25 * auVar28._0_4_),
                 &local_d1);
      p_Var19 = this->_vptr_ROIAlign_x86_avx512[-3];
      auVar28 = vmovshdup_avx(local_c8);
      auVar26 = vmovshdup_avx(local_a8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar18,iVar10,*(int *)(&this->field_0xd4 + (long)p_Var19),
                 *(int *)(&this->field_0xd0 + (long)p_Var19),auVar26._0_4_,local_a8._0_4_,
                 auVar28._0_4_,local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var19),&pre_calc)
      ;
      uVar16 = 0;
      local_d0 = this->_vptr_ROIAlign_x86_avx512;
      auVar29._0_4_ = (float)iVar18;
      auVar36._0_4_ = (float)iVar10;
      local_98._0_8_ = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        local_98._0_8_ = uVar16;
      }
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      auVar32._4_4_ = local_c8._0_4_;
      auVar32._0_4_ = local_c8._0_4_;
      auVar32._8_4_ = local_c8._0_4_;
      auVar32._12_4_ = local_c8._0_4_;
      auVar33._4_4_ = local_a8._0_4_;
      auVar33._0_4_ = local_a8._0_4_;
      auVar33._8_4_ = local_a8._0_4_;
      auVar33._12_4_ = local_a8._0_4_;
      auVar36._4_4_ = auVar36._0_4_;
      auVar36._8_4_ = auVar36._0_4_;
      auVar36._12_4_ = auVar36._0_4_;
      for (; uVar16 != local_98._0_8_; uVar16 = uVar16 + 1) {
        sVar3 = local_b0->cstep;
        sVar4 = local_b0->elemsize;
        pvVar17 = local_b0->data;
        local_c8._0_8_ =
             (void *)(local_88->cstep * uVar16 * local_88->elemsize + (long)local_88->data);
        p_Var19 = local_d0[-3];
        iVar10 = 0;
        uVar12 = 0;
        while ((int)uVar12 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
          uVar9 = uVar12 + 1;
          local_a8._0_4_ = uVar9;
          auVar8 = vpinsrd_avx(ZEXT416(uVar9),uVar12,1);
          auVar8 = vcvtdq2ps_avx(auVar8);
          auVar8 = vfmadd213ps_fma(auVar8,auVar28,auVar26);
          auVar8 = vmaxps_avx(auVar8,ZEXT816(0) << 0x40);
          auVar8 = vminps_avx(auVar29,auVar8);
          auVar27 = vmovshdup_avx(auVar8);
          fVar30 = auVar8._0_4_;
          fVar38 = auVar27._0_4_;
          auVar8 = vroundss_avx(ZEXT416((uint)(fVar30 - fVar38)),ZEXT416((uint)(fVar30 - fVar38)),10
                               );
          lVar20 = 0;
          while( true ) {
            if (*(int *)(&this->field_0xd0 + (long)p_Var19) <= lVar20) break;
            auVar27 = vpinsrd_avx(ZEXT416((uint)(lVar20 + 1)),(int)lVar20,1);
            auVar27 = vcvtudq2ps_avx512vl(auVar27);
            auVar27 = vfmadd213ps_fma(auVar27,auVar32,auVar33);
            auVar27 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
            auVar27 = vminps_avx(auVar27,auVar36);
            auVar34 = vcvtsi2ss_avx512f(in_XMM16,*(int *)(&this->field_0xdc + (long)p_Var19));
            bVar25 = 0 < *(int *)(&this->field_0xdc + (long)p_Var19);
            auVar35 = vmovshdup_avx(auVar27);
            fVar39 = auVar27._0_4_;
            fVar42 = auVar35._0_4_;
            auVar27 = vroundss_avx(ZEXT416((uint)(fVar39 - fVar42)),ZEXT416((uint)(fVar39 - fVar42))
                                   ,10);
            iVar22 = (int)(float)((uint)bVar25 * auVar34._0_4_ + (uint)!bVar25 * auVar8._0_4_);
            iVar21 = (int)(float)((uint)bVar25 * auVar34._0_4_ + (uint)!bVar25 * auVar27._0_4_);
            iVar24 = 0;
            iVar18 = 0;
            if (0 < iVar21) {
              iVar18 = iVar21;
            }
            iVar11 = 0;
            if (0 < iVar22) {
              iVar11 = iVar22;
            }
            fVar40 = 0.0;
            iVar15 = iVar10;
            for (; iVar24 != iVar11; iVar24 = iVar24 + 1) {
              pfVar13 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar15].w1;
              iVar23 = iVar18;
              while (bVar25 = iVar23 != 0, iVar23 = iVar23 + -1, bVar25) {
                auVar27 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)pvVar17 +
                                               CONCAT71((int7)((ulong)p_Var19 >> 8),
                                                        fVar39 <= fVar42 || fVar30 <= fVar38) * 4 +
                                               sVar3 * uVar16 * sVar4));
                auVar41._0_4_ = auVar27._0_4_ * *pfVar13;
                auVar41._4_4_ = auVar27._4_4_ * pfVar13[1];
                auVar41._8_4_ = auVar27._8_4_ * pfVar13[2];
                auVar41._12_4_ = auVar27._12_4_ * pfVar13[3];
                auVar27 = vhaddps_avx(auVar41,auVar41);
                auVar27 = vhaddps_avx(auVar27,auVar27);
                fVar40 = fVar40 + auVar27._0_4_;
                pfVar13 = pfVar13 + 8;
              }
              iVar15 = iVar15 + iVar18;
            }
            auVar27 = vcvtsi2ss_avx512f(in_XMM16,iVar21 * iVar22);
            iVar10 = iVar10 + iVar11 * iVar18;
            *(uint *)(local_c8._0_8_ + lVar20 * 4) =
                 (uint)(fVar39 > fVar42 && fVar30 > fVar38) * (int)(fVar40 / auVar27._0_4_);
            p_Var19 = local_d0[-3];
            lVar20 = lVar20 + 1;
            this = local_80;
          }
          local_c8._0_8_ = local_c8._0_8_ + (long)*(int *)(&this->field_0xd0 + (long)p_Var19) * 4;
          uVar12 = uVar9;
        }
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

int ROIAlign_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}